

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O3

void spell_noxious_ward(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  AFFECT_DATA af;
  AFFECT_DATA AStack_88;
  
  bVar1 = is_affected(ch,sn);
  if (bVar1) {
    send_to_char("You are already protected by a noxious ward.\n\r",ch);
    return;
  }
  init_affect(&AStack_88);
  AStack_88.where = 0;
  AStack_88.aftype = 0;
  AStack_88.type = (short)sn;
  AStack_88.duration = 0xc;
  AStack_88.location = 0;
  AStack_88.modifier = 0;
  AStack_88.mod_name = 8;
  AStack_88.level = (short)level;
  affect_to_char(ch,&AStack_88);
  act("You feel protected by a noxious ward.",ch,(void *)0x0,(void *)0x0,3);
  return;
}

Assistant:

void spell_noxious_ward(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;

	if (is_affected(ch, sn))
	{
		send_to_char("You are already protected by a noxious ward.\n\r", ch);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = sn;
	af.location = 0;
	af.duration = 12;
	af.level = level;
	af.modifier = 0;
	af.mod_name = MOD_PROTECTION;
	affect_to_char(ch, &af);

	act("You feel protected by a noxious ward.", ch, 0, 0, TO_CHAR);
}